

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

Session * FIX::Session::lookupSession(string *string,bool reverse)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  string *psVar4;
  FieldNotFound *anon_var_0;
  string local_540;
  SessionID local_520;
  allocator<char> local_3c9;
  string local_3c8;
  StringField local_3a8;
  StringField local_350;
  SessionID local_2f8;
  FieldBase *local_1a8;
  TargetCompID *targetCompID;
  SenderCompID *senderCompID;
  BeginString *beginString;
  Header *header;
  undefined1 local_178 [8];
  Message message;
  bool reverse_local;
  string *string_local;
  
  message.m_tag._3_1_ = reverse;
  Message::Message((Message *)local_178);
  bVar1 = Message::setStringHeader((Message *)local_178,string);
  if (bVar1) {
    beginString = (BeginString *)Message::getHeader((Message *)local_178);
    senderCompID = (SenderCompID *)FieldMap::getFieldRef((FieldMap *)beginString,8);
    targetCompID = (TargetCompID *)FieldMap::getFieldRef((FieldMap *)beginString,0x31);
    local_1a8 = FieldMap::getFieldRef((FieldMap *)beginString,0x38);
    if ((message.m_tag._3_1_ & 1) == 0) {
      psVar2 = StringField::operator_cast_to_string_(&senderCompID->super_StringField);
      psVar3 = StringField::operator_cast_to_string_(&targetCompID->super_StringField);
      psVar4 = StringField::operator_cast_to_string_((StringField *)local_1a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"",(allocator<char> *)((long)&anon_var_0 + 7));
      SessionID::SessionID(&local_520,psVar2,psVar3,psVar4,&local_540);
      string_local = (string *)lookupSession(&local_520);
      SessionID::~SessionID(&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    else {
      psVar2 = StringField::operator_cast_to_string_(&senderCompID->super_StringField);
      psVar3 = StringField::operator_cast_to_string_((StringField *)local_1a8);
      SenderCompID::SenderCompID((SenderCompID *)&local_350,psVar3);
      psVar3 = StringField::operator_cast_to_string_(&local_350);
      psVar4 = StringField::operator_cast_to_string_(&targetCompID->super_StringField);
      TargetCompID::TargetCompID((TargetCompID *)&local_3a8,psVar4);
      psVar4 = StringField::operator_cast_to_string_(&local_3a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_3c9);
      SessionID::SessionID(&local_2f8,psVar2,psVar3,psVar4,&local_3c8);
      string_local = (string *)lookupSession(&local_2f8);
      SessionID::~SessionID(&local_2f8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      TargetCompID::~TargetCompID((TargetCompID *)&local_3a8);
      SenderCompID::~SenderCompID((SenderCompID *)&local_350);
    }
  }
  else {
    string_local = (string *)0x0;
  }
  header._0_4_ = 1;
  Message::~Message((Message *)local_178);
  return (Session *)string_local;
}

Assistant:

Session *Session::lookupSession(const std::string &string, bool reverse) {
  Message message;
  if (!message.setStringHeader(string)) {
    return nullptr;
  }

  try {
    const Header &header = message.getHeader();
    const BeginString &beginString = FIELD_GET_REF(header, BeginString);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);

    if (reverse) {
      return lookupSession(SessionID(beginString, SenderCompID(targetCompID), TargetCompID(senderCompID)));
    }

    return lookupSession(SessionID(beginString, senderCompID, targetCompID));
  } catch (FieldNotFound &) {
    return nullptr;
  }
}